

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

string * __thiscall
t_java_generator::inner_enum_type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_java_generator *this,t_type *ttype)

{
  uint uVar1;
  t_type *ptVar2;
  allocator local_91;
  string local_90;
  t_type *local_70;
  t_type *elem_type;
  t_set *tset;
  string local_50;
  t_type *local_30;
  t_type *key_type;
  t_map *tmap;
  t_type *ttype_local;
  t_java_generator *this_local;
  
  tmap = (t_map *)ttype;
  ttype_local = (t_type *)this;
  this_local = (t_java_generator *)__return_storage_ptr__;
  tmap = (t_map *)t_generator::get_true_type(ttype);
  uVar1 = (*(tmap->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0x10])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(tmap->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xf])();
    if ((uVar1 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_91);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
    }
    else {
      elem_type = (t_type *)tmap;
      ptVar2 = t_set::get_elem_type((t_set *)tmap);
      local_70 = t_generator::get_true_type(ptVar2);
      type_name_abi_cxx11_(&local_90,this,local_70,true,false,false,false);
      std::operator+(__return_storage_ptr__,&local_90,".class");
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  else {
    key_type = (t_type *)tmap;
    ptVar2 = t_map::get_key_type(tmap);
    local_30 = t_generator::get_true_type(ptVar2);
    type_name_abi_cxx11_(&local_50,this,local_30,true,false,false,false);
    std::operator+(__return_storage_ptr__,&local_50,".class");
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string inner_enum_type_name(t_type* ttype) {
    ttype = get_true_type(ttype);
    if (ttype->is_map()) {
      t_map* tmap = (t_map*)ttype;
      t_type* key_type = get_true_type(tmap->get_key_type());
      return type_name(key_type, true) + ".class";
    } else if (ttype->is_set()) {
      t_set* tset = (t_set*)ttype;
      t_type* elem_type = get_true_type(tset->get_elem_type());
      return type_name(elem_type, true) + ".class";
    }
    return "";
  }